

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

bool __thiscall leveldb::anon_unknown_0::LRUCache::FinishErase(LRUCache *this,LRUHandle *e)

{
  LRUHandle *e_local;
  LRUCache *this_local;
  
  if (e != (LRUHandle *)0x0) {
    if ((e->in_cache & 1U) == 0) {
      __assert_fail("e->in_cache",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                    ,0x135,"bool leveldb::(anonymous namespace)::LRUCache::FinishErase(LRUHandle *)"
                   );
    }
    LRU_Remove(this,e);
    e->in_cache = false;
    this->usage_ = this->usage_ - e->charge;
    Unref(this,e);
  }
  return e != (LRUHandle *)0x0;
}

Assistant:

bool LRUCache::FinishErase(LRUHandle* e) {
  if (e != nullptr) {
    assert(e->in_cache);
    LRU_Remove(e);
    e->in_cache = false;
    usage_ -= e->charge;
    Unref(e);
  }
  return e != nullptr;
}